

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_deleglise_rivat_parallel1.cpp
# Opt level: O1

int256_t * __thiscall
primesum::pi_deleglise_rivat_parallel1
          (int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined4 uVar4;
  primesum *ppVar5;
  ulong uVar6;
  int64_t c;
  runtime_error *this_00;
  undefined4 in_ECX;
  ulong uVar7;
  ulong uVar8;
  undefined4 in_register_00000014;
  string *psVar9;
  long extraout_RDX;
  ulong extraout_RDX_00;
  long lVar10;
  char *pcVar11;
  int iVar12;
  string *expr;
  ulong uVar13;
  ulong uVar14;
  int128_t *piVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  string limit;
  int256_t s1;
  int256_t p2;
  int256_t s2_hard;
  int256_t s2_easy;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c [12];
  string local_158;
  primesum *local_130;
  double local_128;
  string *local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  ulong local_e8;
  int256_t *local_e0;
  string local_d8;
  int256_t local_b8;
  char *local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  int256_t local_78;
  int256_t local_58;
  
  psVar9 = (string *)CONCAT44(in_register_00000014,threads);
  local_118 = CONCAT44(local_118._4_4_,in_ECX);
  if (-(long)psVar9 < (long)(ulong)((primesum *)0x1 < this)) {
    auVar31._4_12_ = in_stack_fffffffffffffe9c;
    auVar31._0_4_ = in_stack_fffffffffffffe98;
    expr = psVar9;
    local_128 = get_alpha_deleglise_rivat(this,(int128_t)auVar31);
    get_max_x_abi_cxx11_(&local_d8,(primesum *)expr,local_128);
    ppVar5 = (primesum *)to_int128((int128_t *)&local_d8,expr);
    if ((SBORROW8(extraout_RDX,(long)psVar9) !=
        SBORROW8(extraout_RDX - (long)psVar9,(ulong)(ppVar5 < this))) !=
        (long)((extraout_RDX - (long)psVar9) - (ulong)(ppVar5 < this)) < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_158,"pi(x): x must be <= ",&local_d8);
      std::runtime_error::runtime_error(this_00,(string *)&local_158);
      *(undefined ***)this_00 = &PTR__runtime_error_001407f0;
      __cxa_throw(this_00,&primesum_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_130 = this;
    local_e0 = __return_storage_ptr__;
    dVar28 = (double)__floattidf(this,psVar9);
    pow(dVar28,0.3333333333333333);
    auVar29 = __fixdfti();
    local_120 = psVar9;
    if ((long)(ulong)(auVar29._0_8_ == 0) <= auVar29._8_8_) {
      do {
        lVar10 = auVar29._8_8_;
        uVar7 = auVar29._0_8_;
        iVar12 = 2;
        auVar31 = ZEXT816(1);
        do {
          auVar31 = auVar29 * auVar31;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        auVar30 = __divti3(local_130,psVar9,uVar7,lVar10);
        uVar13 = (ulong)(auVar30._0_8_ < auVar31._0_8_);
        lVar17 = auVar30._8_8_ - auVar31._8_8_;
        if ((SBORROW8(auVar30._8_8_,auVar31._8_8_) != SBORROW8(lVar17,uVar13)) ==
            (long)(lVar17 - uVar13) < 0) goto LAB_0011e712;
        auVar29._8_8_ = lVar10 + -1 + (ulong)(uVar7 != 0);
        auVar29._0_8_ = uVar7 - 1;
      } while (-lVar10 < (long)(ulong)(1 < uVar7));
      auVar29 = ZEXT816(0);
    }
LAB_0011e712:
    do {
      lVar10 = auVar29._8_8_;
      uVar13 = auVar29._0_8_;
      uVar14 = uVar13 + 1;
      lVar17 = lVar10 + (ulong)(0xfffffffffffffffe < uVar13);
      auVar29._8_8_ = lVar17;
      auVar29._0_8_ = uVar14;
      iVar12 = 2;
      lVar24 = 0;
      uVar7 = 1;
      do {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar14;
        uVar6 = SUB168(auVar30 * auVar3,0);
        lVar24 = lVar24 * uVar14 + uVar7 * lVar17 + SUB168(auVar30 * auVar3,8);
        iVar12 = iVar12 + -1;
        uVar7 = uVar6;
      } while (iVar12 != 0);
      auVar31 = __divti3(local_130,local_120,uVar14,lVar17);
      uVar7 = (ulong)(auVar31._0_8_ < uVar6);
      lVar17 = auVar31._8_8_ - lVar24;
    } while ((SBORROW8(auVar31._8_8_,lVar24) != SBORROW8(lVar17,uVar7)) ==
             (long)(lVar17 - uVar7) < 0);
    dVar28 = (double)__floattidf(uVar13,lVar10);
    psVar9 = local_120;
    ppVar5 = local_130;
    piVar15 = (int128_t *)(long)(local_128 * dVar28);
    c = __divti3(local_130,local_120,piVar15,(long)piVar15 >> 0x3f);
    iVar12 = 6;
    if ((long)piVar15 < 0xd) {
      iVar12 = *(int *)(PhiTiny::pi + (long)piVar15 * 4);
    }
    paVar1 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"=== pi_deleglise_rivat_parallel1(x) ===","");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar4 = (undefined4)local_118;
    x_00._4_12_ = in_stack_fffffffffffffe9c;
    x_00._0_4_ = in_stack_fffffffffffffe98;
    print(ppVar5,(int128_t)x_00,(int64_t)psVar9,(int64_t)piVar15,c,local_128,iVar12);
    x_01._4_12_ = in_stack_fffffffffffffe9c;
    x_01._0_4_ = in_stack_fffffffffffffe98;
    P2((int256_t *)&local_98,ppVar5,(int128_t)x_01,(int64_t)psVar9,(int)piVar15);
    x_02._4_12_ = in_stack_fffffffffffffe9c;
    x_02._0_4_ = in_stack_fffffffffffffe98;
    S1(&local_b8,ppVar5,(int128_t)x_02,(int64_t)psVar9,(int64_t)piVar15,iVar12);
    x_03._4_12_ = in_stack_fffffffffffffe9c;
    x_03._0_4_ = uVar4;
    S2_trivial((int256_t *)&local_158,ppVar5,(int128_t)x_03,(int64_t)psVar9,(int64_t)piVar15,c,
               iVar12);
    x_04._4_12_ = in_stack_fffffffffffffe9c;
    x_04._0_4_ = uVar4;
    S2_easy(&local_58,ppVar5,(int128_t)x_04,(int64_t)psVar9,(int64_t)piVar15,c,iVar12);
    x_05._4_12_ = in_stack_fffffffffffffe9c;
    x_05._0_4_ = uVar4;
    S2_hard(&local_78,ppVar5,(int128_t)x_05,(int64_t)psVar9,(int64_t)piVar15,c,iVar12);
    local_f8 = local_158.field_2._8_8_;
    local_108 = local_158.field_2._M_allocated_capacity;
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_158._M_dataplus._M_p;
    local_e8 = local_158._M_string_length;
    local_100 = local_78.high._8_8_;
    local_110 = (ulong)local_78.high;
    local_120 = (string *)local_78.low._8_8_;
    local_118 = local_b8.high._8_8_;
    local_128 = (double)(ulong)local_b8.high;
    local_130 = (primesum *)(ulong)local_b8.low;
    piVar15 = prime_sum_tiny(piVar15,(int64_t)ppVar5);
    __return_storage_ptr__ = local_e0;
    uVar8 = (long)extraout_RDX_00 >> 0x3f;
    uVar18 = (ulong)local_58.high + local_108 + local_110;
    pcVar11 = local_f0->_M_local_buf + (ulong)local_58.low;
    uVar14 = local_58.low._8_8_ + local_e8 + (ulong)CARRY8((ulong)local_58.low,(ulong)local_f0);
    uVar7 = (ulong)(CARRY8(local_58.low._8_8_,local_e8) ||
                   CARRY8(local_58.low._8_8_ + local_e8,
                          (ulong)CARRY8((ulong)local_58.low,(ulong)local_f0)));
    uVar19 = uVar18 + uVar7;
    pcVar16 = pcVar11 + (ulong)local_78.low;
    uVar13 = (long)local_120 + uVar14;
    uVar6 = uVar13 + CARRY8((ulong)local_78.low,(ulong)pcVar11);
    uVar13 = (ulong)(CARRY8((ulong)local_120,uVar14) ||
                    CARRY8(uVar13,(ulong)CARRY8((ulong)local_78.low,(ulong)pcVar11)));
    uVar20 = uVar19 + uVar13;
    uVar21 = uVar20 + (long)local_128;
    uVar14 = local_b8.low._8_8_ + uVar6;
    uVar25 = uVar14 + CARRY8((ulong)local_130,(ulong)pcVar16);
    uVar14 = (ulong)(CARRY8(local_b8.low._8_8_,uVar6) ||
                    CARRY8(uVar14,(ulong)CARRY8((ulong)local_130,(ulong)pcVar16)));
    uVar22 = uVar21 + uVar14;
    uVar23 = uVar22 + uVar8;
    pcVar11 = (char *)((long)piVar15 + (long)(pcVar16 + (long)local_130));
    uVar6 = (ulong)CARRY8((ulong)piVar15,(ulong)(pcVar16 + (long)local_130));
    uVar2 = uVar25 + extraout_RDX_00;
    uVar26 = uVar2 + uVar6;
    uVar6 = (ulong)(CARRY8(uVar25,extraout_RDX_00) || CARRY8(uVar2,uVar6));
    uVar25 = uVar23 + uVar6;
    pcVar16 = pcVar11 + -1;
    uVar2 = (ulong)(pcVar11 == (char *)0x0);
    uVar27 = uVar26 - uVar2;
    *(undefined8 *)&local_e0->high = 0;
    *(undefined8 *)((long)&local_e0->high + 8) = 0;
    *(undefined8 *)&local_e0->low = 0;
    *(undefined8 *)((long)&local_e0->low + 8) = 0;
    uVar2 = (ulong)(uVar26 < uVar2);
    uVar26 = uVar25 - uVar2;
    lVar17 = uVar26 - local_88;
    lVar10 = (((local_58.high._8_8_ + local_f8 + (ulong)CARRY8((ulong)local_58.high,local_108) +
                local_100 + (ulong)CARRY8((ulong)local_58.high + local_108,local_110) +
                (ulong)CARRY8(uVar18,uVar7) + (ulong)CARRY8(uVar19,uVar13) + local_118 +
                (ulong)CARRY8(uVar20,(ulong)local_128) + (ulong)CARRY8(uVar21,uVar14) + uVar8 +
                (ulong)CARRY8(uVar22,uVar8) + (ulong)CARRY8(uVar23,uVar6)) - (ulong)(uVar25 < uVar2)
              ) - local_80) - (ulong)(uVar26 < local_88);
    *(long *)&local_e0->high = lVar17;
    *(long *)((long)&local_e0->high + 8) = lVar10;
    *(long *)&local_e0->low = (long)pcVar16 - (long)local_98;
    uVar7 = (ulong)(pcVar16 < local_98);
    uVar13 = uVar27 - local_90;
    *(ulong *)((long)&local_e0->low + 8) = uVar13 - uVar7;
    if (uVar27 < local_90 || uVar13 < uVar7) {
      *(long *)&local_e0->high = lVar17 + -1;
      *(ulong *)((long)&local_e0->high + 8) = lVar10 + -1 + (ulong)(lVar17 != 0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_deleglise_rivat_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  string limit = get_max_x(alpha);

  if (x > to_int128(limit))
    throw primesum_error("pi(x): x must be <= " + limit);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t z = (int64_t) (x / y);
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_deleglise_rivat_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, z, c, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}